

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentDiscreteObservations::JointToIndividualObservationIndices
          (MADPComponentDiscreteObservations *this,Index joI)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  EOverflow *this_00;
  long lVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  bool bVar7;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> local_38;
  long local_28;
  
  if (this[10] == (MADPComponentDiscreteObservations)0x0) {
    this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
    EOverflow::EOverflow
              (this_00,
               "MADPComponentDiscreteObservations::JointToIndividualObservationIndices() joint indices are not available, overflow detected"
              );
    __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
  }
  if (this[9] == (MADPComponentDiscreteObservations)0x1) {
    lVar3 = MADPComponentDiscreteObservations::GetJointObservationDiscrete((uint)this);
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + 0x18);
  }
  else {
    lVar4 = *(long *)(this + 0x38) + 8;
    lVar1 = *(long *)(*(long *)(this + 0x38) + 0x10);
    lVar5 = lVar4;
    for (lVar3 = lVar1; lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar7 * 8)) {
      bVar7 = *(uint *)(lVar3 + 0x20) < joI;
      if (!bVar7) {
        lVar5 = lVar3;
      }
    }
    lVar3 = lVar4;
    if ((lVar5 != lVar4) && (lVar3 = lVar5, joI < *(uint *)(lVar5 + 0x20))) {
      lVar3 = lVar4;
    }
    lVar5 = lVar4;
    if (lVar3 == lVar4) {
      pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      IndexTools::JointToIndividualIndices((uint)&local_38,(vector *)(ulong)joI);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pvVar6,&local_38);
      pvVar2 = (void *)CONCAT44(local_38._4_4_,local_38.first);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_28 - (long)pvVar2);
      }
      local_38.first = joI;
      local_38.second = pvVar6;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                (*(_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                   **)(this + 0x38),&local_38);
    }
    else {
      for (; lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar7 * 8)) {
        bVar7 = *(uint *)(lVar1 + 0x20) < joI;
        if (!bVar7) {
          lVar5 = lVar1;
        }
      }
      if ((lVar5 != lVar4) && (*(uint *)(lVar5 + 0x20) <= joI)) {
        lVar4 = lVar5;
      }
      pvVar6 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar4 + 0x28);
    }
  }
  return pvVar6;
}

Assistant:

const std::vector<Index>& 
            JointToIndividualObservationIndices(Index joI) const
        {
            if(!_m_jointIndicesValid)
            {
                throw(EOverflow("MADPComponentDiscreteObservations::JointToIndividualObservationIndices() joint indices are not available, overflow detected"));
            }
            if(_m_cachedAllJointObservations)
                return GetJointObservationDiscrete(joI)->
                    GetIndividualObservationDiscretesIndices();
            else if(_m_jointObservationIndices->find(joI)!=
                    _m_jointObservationIndices->end())
                return(*_m_jointObservationIndices->find(joI)->second);
            else // create new 
            {
                std::vector<Index> *indices=new std::vector<Index>();
                *indices=IndexTools::JointToIndividualIndices(joI,
                                                              GetNrObservations());
                _m_jointObservationIndices->insert(make_pair(joI,indices));
                return(*indices); // deleted in dtor
            }
        }